

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

ALLEGRO_PATH * al_create_path_for_directory(char *str)

{
  ALLEGRO_USTR *us;
  ALLEGRO_PATH *path;
  size_t sVar1;
  ALLEGRO_USTR *pAVar2;
  char *s;
  
  path = al_create_path(str);
  sVar1 = al_ustr_length(path->filename);
  if (sVar1 != 0) {
    us = path->filename;
    pAVar2 = al_ustr_new("");
    path->filename = pAVar2;
    s = al_cstr(us);
    al_append_path_component(path,s);
    al_ustr_free(us);
  }
  return path;
}

Assistant:

ALLEGRO_PATH *al_create_path_for_directory(const char *str)
{
   ALLEGRO_PATH *path = al_create_path(str);
   if (al_ustr_length(path->filename)) {
      ALLEGRO_USTR *last = path->filename;
      path->filename = al_ustr_new("");
      al_append_path_component(path, al_cstr(last));
      al_ustr_free(last);
   }
   return path;
}